

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int ApplyPredictFilter(VP8LEncoder *enc,int width,int height,int quality,int low_effort,
                      int used_subtract_green,VP8LBitWriter *bw,int percent_range,int *percent)

{
  int iVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  int in_stack_00000010;
  int in_stack_00000014;
  VP8LBackwardRefs *in_stack_00000018;
  VP8LHashChain *in_stack_00000020;
  uint32_t *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000060;
  int in_stack_00000068;
  WebPPicture *in_stack_00000070;
  int in_stack_00000078;
  uint32_t *in_stack_00000080;
  uint32_t *in_stack_00000088;
  int in_stack_00000090;
  int min_bits;
  int max_bits;
  int near_lossless_strength;
  int best_bits;
  int *in_stack_000000c0;
  undefined8 uVar2;
  VP8LBitWriter *bw_00;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint32_t local_58;
  int local_34;
  
  ClampBits((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
            (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
            in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
  ClampBits((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
            (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
            in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
  uVar2 = *(undefined8 *)(in_RDI + 0x20);
  bw_00 = *(VP8LBitWriter **)(in_RDI + 0x28);
  iVar1 = VP8LResidualImage(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                            in_stack_00000030,in_stack_00000028,in_stack_00000080,in_stack_00000088,
                            in_stack_00000090,max_bits,best_bits,
                            (WebPPicture *)CONCAT44(quality,low_effort),height,(int *)enc,
                            in_stack_000000c0);
  if (iVar1 == 0) {
    local_34 = 0;
  }
  else {
    VP8LPutBits(bw_00,(uint32_t)((ulong)uVar2 >> 0x20),(int)uVar2);
    VP8LPutBits(bw_00,(uint32_t)((ulong)uVar2 >> 0x20),(int)uVar2);
    VP8LPutBits(bw_00,(uint32_t)((ulong)uVar2 >> 0x20),(int)uVar2);
    *(uint32_t *)(in_RDI + 0x48) = local_58;
    VP8LSubSampleSize(in_ESI,local_58);
    VP8LSubSampleSize(in_EDX,local_58);
    local_34 = EncodeImageNoHuffman
                         ((VP8LBitWriter *)CONCAT44(in_stack_00000034,in_stack_00000030),
                          in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014,
                          in_stack_00000010,in_stack_00000060,in_stack_00000068,in_stack_00000070,
                          in_stack_00000078,(int *)in_stack_00000080);
  }
  return local_34;
}

Assistant:

static int ApplyPredictFilter(VP8LEncoder* const enc, int width, int height,
                              int quality, int low_effort,
                              int used_subtract_green, VP8LBitWriter* const bw,
                              int percent_range, int* const percent) {
  int best_bits;
  const int near_lossless_strength =
      enc->use_palette ? 100 : enc->config->near_lossless;
  const int max_bits = ClampBits(width, height, enc->predictor_transform_bits,
                                 MIN_TRANSFORM_BITS, MAX_TRANSFORM_BITS,
                                 MAX_PREDICTOR_IMAGE_SIZE);
  const int min_bits = ClampBits(
      width, height,
      max_bits - 2 * (enc->config->method > 4 ? enc->config->method - 4 : 0),
      MIN_TRANSFORM_BITS, MAX_TRANSFORM_BITS, MAX_PREDICTOR_IMAGE_SIZE);

  if (!VP8LResidualImage(width, height, min_bits, max_bits, low_effort,
                         enc->argb, enc->argb_scratch, enc->transform_data,
                         near_lossless_strength, enc->config->exact,
                         used_subtract_green, enc->pic, percent_range / 2,
                         percent, &best_bits)) {
    return 0;
  }
  VP8LPutBits(bw, TRANSFORM_PRESENT, 1);
  VP8LPutBits(bw, PREDICTOR_TRANSFORM, 2);
  assert(best_bits >= MIN_TRANSFORM_BITS && best_bits <= MAX_TRANSFORM_BITS);
  VP8LPutBits(bw, best_bits - MIN_TRANSFORM_BITS, NUM_TRANSFORM_BITS);
  enc->predictor_transform_bits = best_bits;
  return EncodeImageNoHuffman(
      bw, enc->transform_data, &enc->hash_chain, &enc->refs[0],
      VP8LSubSampleSize(width, best_bits), VP8LSubSampleSize(height, best_bits),
      quality, low_effort, enc->pic, percent_range - percent_range / 2,
      percent);
}